

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_K.H
# Opt level: O0

void amrex::mlndlap_unimpose_neumann_bc
               (Box *bx,Array4<double> *rhs,Box *nddom,GpuArray<amrex::LinOpBCType,_3U> *lobc,
               GpuArray<amrex::LinOpBCType,_3U> *hibc)

{
  GpuArray<amrex::LinOpBCType,_3U> *in_stack_000000c8;
  GpuArray<amrex::LinOpBCType,_3U> *in_stack_000000d0;
  Box *in_stack_000000d8;
  Array4<double> *in_stack_000000e0;
  Box *in_stack_000000e8;
  Real in_stack_000000f0;
  
  anon_unknown_1::mlndlap_scale_neumann_bc
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
             in_stack_000000d0,in_stack_000000c8);
  return;
}

Assistant:

inline void
mlndlap_unimpose_neumann_bc (Box const& bx, Array4<Real> const& rhs, Box const& nddom,
                           GpuArray<LinOpBCType,AMREX_SPACEDIM> const& lobc,
                           GpuArray<LinOpBCType,AMREX_SPACEDIM> const& hibc) noexcept
{
    mlndlap_scale_neumann_bc(0.5, bx, rhs, nddom, lobc, hibc);
}